

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilder::PreAlign(FlatBufferBuilder *this,size_t len,size_t alignment)

{
  uint8_t *__s;
  ulong uVar1;
  
  uVar1 = -((uint)(((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) +
                  *(int *)&(this->buf_).buf_) + len);
  __s = vector_downward::make_space(&this->buf_,alignment - 1 & uVar1);
  uVar1 = alignment - 1 & uVar1;
  if (uVar1 != 0) {
    memset(__s,0,uVar1);
    return;
  }
  return;
}

Assistant:

void PreAlign(size_t len, size_t alignment) {
    buf_.fill(PaddingBytes(GetSize() + len, alignment));
  }